

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

ecp_curve_type ecp_get_type(mbedtls_ecp_group *grp)

{
  mbedtls_ecp_group *grp_local;
  
  if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
    grp_local._4_4_ = ECP_TYPE_NONE;
  }
  else if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    grp_local._4_4_ = ECP_TYPE_MONTGOMERY;
  }
  else {
    grp_local._4_4_ = ECP_TYPE_SHORT_WEIERSTRASS;
  }
  return grp_local._4_4_;
}

Assistant:

static inline ecp_curve_type ecp_get_type( const mbedtls_ecp_group *grp )
{
    if( grp->G.X.p == NULL )
        return( ECP_TYPE_NONE );

    if( grp->G.Y.p == NULL )
        return( ECP_TYPE_MONTGOMERY );
    else
        return( ECP_TYPE_SHORT_WEIERSTRASS );
}